

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>>
          (Serializer *this,
          vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
          *vec)

{
  pointer puVar1;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *item;
  pointer ptr;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (vec->
           super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptr = (vec->
             super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start; ptr != puVar1; ptr = ptr + 1) {
    WriteValue<duckdb::MacroFunction>(this,ptr);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}